

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void ctype_preptype(CTRepr *ctr,CType *ct,CTInfo qual,char *t)

{
  uint64_t uVar1;
  size_t sVar2;
  GCstr *str;
  char *t_local;
  CTInfo qual_local;
  CType *ct_local;
  CTRepr *ctr_local;
  
  if ((ct->name).gcptr64 == 0) {
    if (ctr->needsp != 0) {
      ctype_prepc(ctr,0x20);
    }
    ctype_prepnum(ctr,(uint32_t)(((long)ct - (long)ctr->cts->tab) / 0x18));
    ctr->needsp = 1;
  }
  else {
    uVar1 = (ct->name).gcptr64;
    ctype_prepstr(ctr,(char *)(uVar1 + 0x18),*(MSize *)(uVar1 + 0x14));
  }
  sVar2 = strlen(t);
  ctype_prepstr(ctr,t,(MSize)sVar2);
  ctype_prepqual(ctr,qual);
  return;
}

Assistant:

static void ctype_preptype(CTRepr *ctr, CType *ct, CTInfo qual, const char *t)
{
  if (gcref(ct->name)) {
    GCstr *str = gco2str(gcref(ct->name));
    ctype_prepstr(ctr, strdata(str), str->len);
  } else {
    if (ctr->needsp) ctype_prepc(ctr, ' ');
    ctype_prepnum(ctr, ctype_typeid(ctr->cts, ct));
    ctr->needsp = 1;
  }
  ctype_prepstr(ctr, t, (MSize)strlen(t));
  ctype_prepqual(ctr, qual);
}